

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_comment_cpp(CPState *cp)

{
  byte *pbVar1;
  bool bVar2;
  CPState *cp_local;
  int local_10;
  
  do {
    pbVar1 = (byte *)cp->p;
    cp->p = (char *)(pbVar1 + 1);
    cp->c = (uint)*pbVar1;
    if (cp->c == 0x5c) {
      local_10 = cp_get_bs(cp);
    }
    else {
      local_10 = cp->c;
    }
    bVar2 = false;
    if (local_10 != 10 && local_10 != 0xd) {
      bVar2 = cp->c != 0;
    }
  } while (bVar2);
  return;
}

Assistant:

static void cp_comment_cpp(CPState *cp)
{
  while (!cp_iseol(cp_get(cp)) && cp->c != '\0')
    ;
}